

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

void handle_configure_request(xcb_connection_t *connection,xcb_configure_request_event_t *event)

{
  ushort uVar1;
  ulong uVar2;
  uint *puVar3;
  byte bVar4;
  uint local_38 [2];
  uint32_t values [6];
  
  uVar1 = event->value_mask;
  bVar4 = (uVar1 & 1) != 0;
  if ((bool)bVar4) {
    puVar3 = local_38 + 1;
    local_38[0] = (uint)(ushort)event->x;
  }
  else {
    puVar3 = local_38;
  }
  uVar2 = (ulong)bVar4;
  if ((uVar1 & 2) != 0) {
    bVar4 = bVar4 | 2;
    *puVar3 = (uint)(ushort)event->y;
    uVar2 = uVar2 + 1;
  }
  if ((uVar1 & 4) != 0) {
    bVar4 = bVar4 | 4;
    local_38[uVar2] = (uint)event->width;
    uVar2 = uVar2 + 1;
  }
  if ((uVar1 & 8) != 0) {
    bVar4 = bVar4 | 8;
    local_38[uVar2] = (uint)event->height;
    uVar2 = uVar2 + 1;
  }
  if ((uVar1 & 0x20) != 0) {
    bVar4 = bVar4 | 0x20;
    local_38[uVar2] = event->sibling;
    uVar2 = uVar2 + 1;
  }
  if ((uVar1 & 0x40) == 0) {
    if (bVar4 == 0) {
      return;
    }
  }
  else {
    bVar4 = bVar4 | 0x40;
    local_38[uVar2] = (uint)event->stack_mode;
  }
  xcb_configure_window(connection,event->window,bVar4,local_38);
  return;
}

Assistant:

static void handle_configure_request(xcb_connection_t *connection,
                                     xcb_configure_request_event_t *event)
{
        uint16_t mask = 0;
        uint32_t values[6];
        size_t value_index = 0;

        // Configure the new window dimentions
        if (event->value_mask & XCB_CONFIG_WINDOW_X) {
                mask |= XCB_CONFIG_WINDOW_X;
                values[value_index] = (uint16_t)event->x;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_Y) {
                mask |= XCB_CONFIG_WINDOW_Y;
                values[value_index] = (uint16_t)event->y;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_WIDTH) {
                mask |= XCB_CONFIG_WINDOW_WIDTH;
                values[value_index] = event->width;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_HEIGHT) {
                mask |= XCB_CONFIG_WINDOW_HEIGHT;
                values[value_index] = event->height;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_SIBLING) {
                mask |= XCB_CONFIG_WINDOW_SIBLING;
                values[value_index] = event->sibling;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_STACK_MODE) {
                mask |= XCB_CONFIG_WINDOW_STACK_MODE;
                values[value_index] = event->stack_mode;

                value_index++;
        }

        if (mask == 0) {
                // Nothing to do (we ignore XCB_CONFIG_WINDOW_BORDER_WIDTH)
                return;
        }

        xcb_configure_window(connection, event->window, mask, (uint32_t *)&values);
}